

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O3

void __thiscall
duckdb::BatchInsertLocalState::CreateNewCollection
          (BatchInsertLocalState *this,ClientContext *context,DuckTableEntry *table_entry,
          vector<duckdb::LogicalType,_true> *insert_types)

{
  BatchInsertLocalState *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  shared_ptr<duckdb::DataTableInfo,_true> *psVar3;
  undefined4 extraout_var_00;
  TableIOManager *io_manager;
  unsigned_long row_start;
  RowGroupCollection *this_00;
  pointer pRVar4;
  undefined4 extraout_var_01;
  PhysicalIndex PVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_80;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_78;
  shared_ptr<duckdb::DataTableInfo,_true> local_70;
  ClientContext *local_60;
  BatchInsertLocalState *local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_50;
  vector<duckdb::LogicalType,_true> local_48;
  
  local_60 = context;
  local_58 = this;
  local_50 = &insert_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  iVar2 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
  psVar3 = DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar2));
  local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psVar3->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (psVar3->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
  io_manager = TableIOManager::Get((DataTable *)CONCAT44(extraout_var_00,iVar2));
  row_start = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
  this_00 = (RowGroupCollection *)operator_new(0x90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48,local_50
            );
  RowGroupCollection::RowGroupCollection(this_00,&local_70,io_manager,&local_48,row_start,0);
  local_80._M_head_impl = this_00;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_48);
  pBVar1 = local_58;
  if (local_70.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.internal.
               super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pRVar4 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
           ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                         *)&local_80);
  RowGroupCollection::InitializeEmpty(pRVar4);
  pRVar4 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
           ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                         *)&local_80);
  RowGroupCollection::InitializeAppend(pRVar4,&pBVar1->current_append_state);
  iVar2 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
  local_78._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (RowGroupCollection *)0x0;
  PVar5 = DataTable::CreateOptimisticCollection
                    ((DataTable *)CONCAT44(extraout_var_01,iVar2),local_60,
                     (unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                      *)&local_78);
  (pBVar1->collection_index).index = PVar5.index;
  if (local_78._M_head_impl != (RowGroupCollection *)0x0) {
    ::std::default_delete<duckdb::RowGroupCollection>::operator()
              ((default_delete<duckdb::RowGroupCollection> *)&local_78,local_78._M_head_impl);
  }
  local_78._M_head_impl = (RowGroupCollection *)0x0;
  if (local_80._M_head_impl != (RowGroupCollection *)0x0) {
    ::std::default_delete<duckdb::RowGroupCollection>::operator()
              ((default_delete<duckdb::RowGroupCollection> *)&local_80,local_80._M_head_impl);
  }
  return;
}

Assistant:

void CreateNewCollection(ClientContext &context, DuckTableEntry &table_entry,
	                         const vector<LogicalType> &insert_types) {
		auto table_info = table_entry.GetStorage().GetDataTableInfo();
		auto &io_manager = TableIOManager::Get(table_entry.GetStorage());

		// Create the local row group collection.
		auto max_row_id = NumericCast<idx_t>(MAX_ROW_ID);
		auto collection = make_uniq<RowGroupCollection>(std::move(table_info), io_manager, insert_types, max_row_id);
		collection->InitializeEmpty();
		collection->InitializeAppend(current_append_state);

		auto &data_table = table_entry.GetStorage();
		collection_index = data_table.CreateOptimisticCollection(context, std::move(collection));
	}